

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::Diagnostic>::reallocateTo
          (SmallVectorBase<slang::Diagnostic> *this,size_type newCapacity)

{
  Diagnostic *__last;
  iterator ctx;
  Diagnostic *in_RSI;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  pointer newData;
  
  __last = (Diagnostic *)operator_new(0x17c523);
  begin(in_RDI);
  ctx = end(in_RDI);
  std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>(in_RSI,__last,(Diagnostic *)in_RDI)
  ;
  cleanup(in_RDI,(EVP_PKEY_CTX *)ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }